

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

Ref __thiscall cashew::ValueBuilder::makeCall(ValueBuilder *this,IString target)

{
  Ref RVar1;
  Ref r;
  Value *pVVar2;
  char *extraout_RDX;
  IString name;
  
  name.str._M_len = target.str._M_len;
  RVar1 = makeRawArray(3);
  r = makeRawString((IString *)&CALL);
  pVVar2 = Value::push_back(RVar1.inst,r);
  name.str._M_str = extraout_RDX;
  RVar1 = makeName(this,name);
  pVVar2 = Value::push_back(pVVar2,RVar1);
  RVar1 = makeRawArray(0);
  RVar1.inst = Value::push_back(pVVar2,RVar1);
  return (Ref)RVar1.inst;
}

Assistant:

static Ref makeCall(IString target) {
    Ref ret = &makeRawArray(3)
                 ->push_back(makeRawString(CALL))
                 .push_back(makeName(target))
                 .push_back(makeRawArray());
    return ret;
  }